

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_db_readonly(sqlite3 *db,char *zDbName)

{
  uint uVar1;
  Btree *pBVar2;
  
  if (zDbName == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = sqlite3FindDbName(db,zDbName);
  }
  if ((int)uVar1 < 0) {
    pBVar2 = (Btree *)0x0;
  }
  else {
    pBVar2 = db->aDb[uVar1].pBt;
  }
  if (pBVar2 == (Btree *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = pBVar2->pBt->btsFlags & 1;
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_db_readonly(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return -1;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeIsReadonly(pBt) : -1;
}